

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O1

int Rescale(uint8_t *src,int src_stride,int new_lines,WebPRescaler *wrk)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (new_lines < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      iVar2 = WebPRescalerImport(wrk,new_lines,src,src_stride);
      src = src + iVar2 * src_stride;
      iVar3 = WebPRescalerExport(wrk);
      iVar4 = iVar4 + iVar3;
      iVar3 = new_lines - iVar2;
      bVar1 = iVar2 <= new_lines;
      new_lines = iVar3;
    } while (iVar3 != 0 && bVar1);
  }
  return iVar4;
}

Assistant:

static int Rescale(const uint8_t* src, int src_stride,
                   int new_lines, WebPRescaler* const wrk) {
  int num_lines_out = 0;
  while (new_lines > 0) {    // import new contributions of source rows.
    const int lines_in = WebPRescalerImport(wrk, new_lines, src, src_stride);
    src += lines_in * src_stride;
    new_lines -= lines_in;
    num_lines_out += WebPRescalerExport(wrk);    // emit output row(s)
  }
  return num_lines_out;
}